

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O2

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
phmap::priv::GenerateValuesWithSeed<std::pair<long,long>>
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,priv *this,size_t n,int maxval,int seed)

{
  int maxval_00;
  size_t i;
  priv *ppVar1;
  Generator<std::pair<long,_long>_> gen;
  vector<int,_std::allocator<int>_> nums;
  Generator<std::pair<long,_long>_> local_60;
  pair<long,_long> local_58;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  maxval_00 = (int)n;
  GenerateNumbersWithSeed
            ((vector<int,_std::allocator<int>_> *)&local_48,(size_t)this,maxval_00,maxval);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.tgen.maxval = maxval_00;
  local_60.ugen.maxval = maxval_00;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::reserve
            (__return_storage_ptr__,(size_type)this);
  for (ppVar1 = (priv *)0x0; this != ppVar1; ppVar1 = ppVar1 + 1) {
    local_58 = Generator<std::pair<long,_long>_>::operator()
                         (&local_60,local_48._M_impl.super__Vector_impl_data._M_start[(long)ppVar1])
    ;
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
    emplace_back<std::pair<long,long>>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
               __return_storage_ptr__,&local_58);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<V> GenerateValuesWithSeed(size_t n, int maxval, int seed) {
        const std::vector<int> nums = GenerateNumbersWithSeed(n, maxval, seed);
        Generator<V> gen(maxval);
        std::vector<V> vec;

        vec.reserve(n);
        for (size_t i = 0; i < n; i++) {
            vec.push_back(gen(nums[i]));
        }

        return vec;
    }